

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O0

void __thiscall
sock_tests::recv_until_terminator_limit::test_method(recv_until_terminator_limit *this)

{
  milliseconds timeout_00;
  milliseconds timeout_01;
  Span<const_char> data;
  Span<const_char> data_00;
  bool bVar1;
  long in_FS_OFFSET;
  thread receiver;
  minutes timeout;
  Sock sock_recv;
  Sock sock_send;
  int s [2];
  CThreadInterrupt interrupt;
  CThreadInterrupt *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  assertion_result *in_stack_fffffffffffffcf8;
  undefined6 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd06;
  undefined1 in_stack_fffffffffffffd07;
  Sock *in_stack_fffffffffffffd08;
  const_string *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  lazy_ostream *in_stack_fffffffffffffd20;
  unit_test_log_t *in_stack_fffffffffffffd28;
  int *in_stack_fffffffffffffd40;
  const_string local_220;
  const_string local_138;
  lazy_ostream local_128 [2];
  assertion_result local_108 [3];
  undefined1 *local_b8;
  undefined8 *local_b0;
  undefined1 *local_a8;
  undefined8 local_98;
  undefined1 local_90 [40];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = 1;
  CThreadInterrupt::CThreadInterrupt(in_stack_fffffffffffffce8);
  CreateSocketPair(in_stack_fffffffffffffd40);
  Sock::Sock((Sock *)in_stack_fffffffffffffce8,0);
  Sock::Sock((Sock *)in_stack_fffffffffffffce8,0);
  local_b8 = local_90;
  local_b0 = &local_98;
  local_a8 = local_68;
  std::thread::thread<sock_tests::recv_until_terminator_limit::test_method()::__0,,void>
            ((thread *)in_stack_fffffffffffffd20,
             (type *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  do {
    Span<const_char>::Span<8>((Span<const_char> *)in_stack_fffffffffffffce8,(char (*) [8])0xaf4045);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffce8);
    data.m_size = (size_t)in_stack_fffffffffffffd28;
    data.m_data = (char *)in_stack_fffffffffffffd20;
    timeout_00.__r._7_1_ = in_stack_fffffffffffffd1f;
    timeout_00.__r._0_7_ = in_stack_fffffffffffffd18;
    Sock::SendComplete(in_stack_fffffffffffffd08,data,timeout_00,
                       (CThreadInterrupt *)
                       CONCAT17(in_stack_fffffffffffffd07,
                                CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
                 (pointer)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (unsigned_long)in_stack_fffffffffffffce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffd28,(const_string *)in_stack_fffffffffffffd20,
                 CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                 in_stack_fffffffffffffd10);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffcf8,(bool)in_stack_fffffffffffffcf7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (char (*) [78])in_stack_fffffffffffffce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
                 (pointer)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (unsigned_long)in_stack_fffffffffffffce8);
      in_stack_fffffffffffffce8 = (CThreadInterrupt *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_108,local_128,&local_138,0xa6,REQUIRE,CHECK_MSG);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[78],_const_char_(&)[78]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[78],_const_char_(&)[78]>
                          *)in_stack_fffffffffffffce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    Span<const_char>::Span<5>((Span<const_char> *)in_stack_fffffffffffffce8,(char (*) [5])0xaf43b9);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffce8);
    data_00.m_size = (size_t)in_stack_fffffffffffffd28;
    data_00.m_data = (char *)in_stack_fffffffffffffd20;
    timeout_01.__r._7_1_ = in_stack_fffffffffffffd1f;
    timeout_01.__r._0_7_ = in_stack_fffffffffffffd18;
    Sock::SendComplete(in_stack_fffffffffffffd08,data_00,timeout_01,
                       (CThreadInterrupt *)
                       CONCAT17(in_stack_fffffffffffffd07,
                                CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
    do {
      in_stack_fffffffffffffd28 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
                 (pointer)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (unsigned_long)in_stack_fffffffffffffce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffd28,(const_string *)in_stack_fffffffffffffd20,
                 CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                 in_stack_fffffffffffffd10);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffcf8,(bool)in_stack_fffffffffffffcf7);
      in_stack_fffffffffffffd20 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (char (*) [76])in_stack_fffffffffffffce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8,
                 (pointer)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (unsigned_long)in_stack_fffffffffffffce8);
      in_stack_fffffffffffffce8 = (CThreadInterrupt *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xfffffffffffffe10,
                 (lazy_ostream *)&stack0xfffffffffffffdf0,&local_220,0xa7,REQUIRE,CHECK_MSG);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[76],_const_char_(&)[76]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[76],_const_char_(&)[76]>
                          *)in_stack_fffffffffffffce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffce8);
      in_stack_fffffffffffffd1f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffd1f);
    in_stack_fffffffffffffd06 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd06);
  std::thread::join();
  std::thread::~thread((thread *)in_stack_fffffffffffffce8);
  Sock::~Sock((Sock *)in_stack_fffffffffffffce8);
  Sock::~Sock((Sock *)in_stack_fffffffffffffce8);
  CThreadInterrupt::~CThreadInterrupt(in_stack_fffffffffffffce8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(recv_until_terminator_limit)
{
    constexpr auto timeout = 1min; // High enough so that it is never hit.
    CThreadInterrupt interrupt;
    int s[2];
    CreateSocketPair(s);

    Sock sock_send(s[0]);
    Sock sock_recv(s[1]);

    std::thread receiver([&sock_recv, &timeout, &interrupt]() {
        constexpr size_t max_data{10};
        bool threw_as_expected{false};
        // BOOST_CHECK_EXCEPTION() writes to some variables shared with the main thread which
        // creates a data race. So mimic it manually.
        try {
            (void)sock_recv.RecvUntilTerminator('\n', timeout, interrupt, max_data);
        } catch (const std::runtime_error& e) {
            threw_as_expected = HasReason("too many bytes without a terminator")(e);
        }
        assert(threw_as_expected);
    });

    BOOST_REQUIRE_NO_THROW(sock_send.SendComplete("1234567", timeout, interrupt));
    BOOST_REQUIRE_NO_THROW(sock_send.SendComplete("89a\n", timeout, interrupt));

    receiver.join();
}